

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::TestTextureCubeArray::TestTextureCubeArray
          (TestTextureCubeArray *this,CompressedTexFormat *format,int size,int arraySize)

{
  uint uVar1;
  int iVar2;
  value_type local_80;
  uint local_58;
  uint local_54;
  int layerNdx;
  int levelNdx;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> layers;
  TextureFormat local_28;
  int local_20;
  int local_1c;
  int arraySize_local;
  int size_local;
  CompressedTexFormat *format_local;
  TestTextureCubeArray *this_local;
  
  local_20 = arraySize;
  local_1c = size;
  _arraySize_local = format;
  format_local = (CompressedTexFormat *)this;
  TestTexture::TestTexture(&this->super_TestTexture,format,size,size,arraySize);
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTextureCubeArray_01661048;
  local_28 = tcu::getUncompressedFormat(*_arraySize_local);
  tcu::TextureCubeArray::TextureCubeArray(&this->m_texture,&local_28,local_1c,local_20);
  allocateLevels<tcu::TextureCubeArray>(&this->m_texture);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&layerNdx);
  local_54 = 0;
  while( true ) {
    uVar1 = local_54;
    iVar2 = tcu::TextureLevelPyramid::getNumLevels(&(this->m_texture).super_TextureLevelPyramid);
    if (iVar2 <= (int)uVar1) break;
    local_58 = 0;
    while( true ) {
      uVar1 = local_58;
      iVar2 = tcu::TextureCubeArray::getDepth(&this->m_texture);
      if (iVar2 <= (int)uVar1) break;
      (*(this->super_TestTexture)._vptr_TestTexture[7])
                (&local_80,this,(ulong)local_54,(ulong)local_58);
      std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::push_back
                ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                 &layerNdx,&local_80);
      local_58 = local_58 + 1;
    }
    local_54 = local_54 + 1;
  }
  TestTexture::populateCompressedLevels
            (&this->super_TestTexture,*_arraySize_local,
             (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&layerNdx);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::~vector
            ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&layerNdx);
  return;
}

Assistant:

TestTextureCubeArray::TestTextureCubeArray (const tcu::CompressedTexFormat& format, int size, int arraySize)
	: TestTexture	(format, size, size, arraySize)
	, m_texture		(tcu::getUncompressedFormat(format), size, arraySize)
{
	DE_ASSERT(arraySize % 6 == 0);

	allocateLevels(m_texture);

	std::vector<tcu::PixelBufferAccess> layers;
	for (int levelNdx = 0; levelNdx < m_texture.getNumLevels(); levelNdx++)
		for (int layerNdx = 0; layerNdx < m_texture.getDepth(); layerNdx++)
			layers.push_back(getLevel(levelNdx, layerNdx));

	TestTexture::populateCompressedLevels(format, layers);
}